

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::CelsiusDebugBRegister::~CelsiusDebugBRegister(CelsiusDebugBRegister *this)

{
  pointer pcVar1;
  
  (this->super_DebugBRegister).super_SimpleMmioRegister.super_MmioRegister.super_Register.
  _vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_003537f8;
  pcVar1 = (this->super_DebugBRegister).super_SimpleMmioRegister.name_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_DebugBRegister).super_SimpleMmioRegister.name_.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void write(int cnum, uint32_t val) override {
		// fuck you
		uint32_t mangled = val & 0x3fffffff;
		if (val & 1 << 30)
			mangled |= 1 << 31;
		if (val & 1 << 31)
			mangled |= 1 << 30;
		nva_wr32(cnum, addr, mangled);
	}